

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  char *__s;
  string_view arg;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dagChecker,"AUTOUIC_OPTIONS",(allocator<char> *)&local_120);
  __s = GetLinkInterfaceDependentStringProperty(this,(string *)&dagChecker,config);
  std::__cxx11::string::~string((string *)&dagChecker);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"AUTOUIC_OPTIONS",(allocator<char> *)&local_120);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_c0,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,__s,&local_121);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_120,&local_e0,this->LocalGenerator,config,this,&dagChecker,
               (cmGeneratorTarget *)0x0,&local_100);
    arg._M_str = local_120._M_dataplus._M_p;
    arg._M_len = local_120._M_string_length;
    cmExpandList(arg,result,false);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "AUTOUIC_OPTIONS", nullptr,
                                             nullptr);
  cmExpandList(cmGeneratorExpression::Evaluate(prop, this->LocalGenerator,
                                               config, this, &dagChecker),
               result);
}